

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O3

vector<int,_std::allocator<int>_> * muduo::ProcessInfo::threads(void)

{
  pointer piVar1;
  pointer piVar2;
  long lVar3;
  ulong uVar4;
  vector<int,_std::allocator<int>_> *in_RDI;
  long in_FS_OFFSET;
  dirent **namelist;
  dirent **local_20;
  
  (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  *(vector<int,_std::allocator<int>_> **)(in_FS_OFFSET + -8) = in_RDI;
  local_20 = (dirent **)0x0;
  scandir("/proc/self/task",&local_20,detail::taskDirFilter,alphasort);
  *(undefined8 *)(in_FS_OFFSET + -8) = 0;
  piVar1 = (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar1 != piVar2) {
    uVar4 = (long)piVar2 - (long)piVar1 >> 2;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar1,piVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar1,piVar2);
  }
  return in_RDI;
}

Assistant:

std::vector<pid_t> ProcessInfo::threads()
{
  std::vector<pid_t> result;
  t_pids = &result;
  scanDir("/proc/self/task", taskDirFilter);
  t_pids = NULL;
  std::sort(result.begin(), result.end());
  return result;
}